

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::GreaterThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  long lVar8;
  const_reference pvVar9;
  idx_t iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  idx_t iVar15;
  long lVar16;
  long lVar17;
  idx_t iVar18;
  idx_t iVar19;
  bool bVar20;
  value_type rhs_offset_in_row;
  interval_t *lhs_data;
  idx_t entry_idx;
  uchar **rhs_locations;
  idx_t local_80;
  idx_t local_78;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar9 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar9;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar2->sel_vector;
      local_80 = 0;
      iVar19 = 0;
      do {
        iVar18 = iVar19;
        if (psVar6 != (sel_t *)0x0) {
          iVar18 = (idx_t)psVar6[iVar19];
        }
        iVar10 = iVar18;
        if (psVar7 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar7[iVar18];
        }
        lVar11 = *(long *)(pdVar4 + iVar18 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar11 + (col_idx >> 3))) == 0) {
LAB_012b7d0d:
          *no_match_count = local_78 + 1;
          no_match_sel->sel_vector[local_78] = (sel_t)iVar18;
          local_78 = local_78 + 1;
        }
        else {
          lVar14 = iVar10 * 0x10;
          lVar8 = *(long *)(lVar11 + 8 + vVar5);
          lVar13 = (long)*(int *)(pdVar3 + lVar14 + 4) +
                   *(long *)(pdVar3 + lVar14 + 8) / 86400000000;
          lVar12 = lVar13 % 0x1e;
          lVar17 = (long)*(int *)(pdVar3 + lVar14) + lVar13 / 0x1e;
          lVar16 = (*(long *)(lVar11 + vVar5) >> 0x20) + lVar8 / 86400000000;
          lVar13 = lVar16 % 0x1e;
          lVar11 = (long)(int)*(long *)(lVar11 + vVar5) + lVar16 / 0x1e;
          if ((lVar17 <= lVar11) &&
             ((lVar17 < lVar11 ||
              ((lVar12 <= lVar13 &&
               ((lVar12 < lVar13 ||
                (*(long *)(pdVar3 + lVar14 + 8) % 86400000000 <= lVar8 % 86400000000))))))))
          goto LAB_012b7d0d;
          psVar6[local_80] = (sel_t)iVar18;
          local_80 = local_80 + 1;
        }
        iVar19 = iVar19 + 1;
        if (count == iVar19) {
          return local_80;
        }
      } while( true );
    }
  }
  else if (count != 0) {
    psVar6 = sel->sel_vector;
    psVar7 = pSVar2->sel_vector;
    puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    local_80 = 0;
    iVar18 = 0;
    iVar19 = *no_match_count;
    do {
      iVar10 = iVar18;
      if (psVar6 != (sel_t *)0x0) {
        iVar10 = (idx_t)psVar6[iVar18];
      }
      iVar15 = iVar10;
      if (psVar7 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar7[iVar10];
      }
      if (puVar1 == (unsigned_long *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = (puVar1[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) == 0;
      }
      if ((bVar20) ||
         (lVar11 = *(long *)(pdVar4 + iVar10 * 8),
         ((uint)*(byte *)(lVar11 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_012b7b55:
        iVar15 = iVar19 + 1;
        *no_match_count = iVar15;
        no_match_sel->sel_vector[iVar19] = (sel_t)iVar10;
      }
      else {
        lVar16 = iVar15 * 0x10;
        lVar8 = *(long *)(lVar11 + 8 + vVar5);
        lVar13 = (long)*(int *)(pdVar3 + lVar16 + 4) + *(long *)(pdVar3 + lVar16 + 8) / 86400000000;
        lVar17 = lVar13 % 0x1e;
        lVar14 = (long)*(int *)(pdVar3 + lVar16) + lVar13 / 0x1e;
        lVar12 = (*(long *)(lVar11 + vVar5) >> 0x20) + lVar8 / 86400000000;
        lVar13 = lVar12 % 0x1e;
        lVar11 = (long)(int)*(long *)(lVar11 + vVar5) + lVar12 / 0x1e;
        if ((lVar14 <= lVar11) &&
           ((lVar14 < lVar11 ||
            ((lVar17 <= lVar13 &&
             ((lVar17 < lVar13 ||
              (*(long *)(pdVar3 + lVar16 + 8) % 86400000000 <= lVar8 % 86400000000))))))))
        goto LAB_012b7b55;
        psVar6[local_80] = (sel_t)iVar10;
        local_80 = local_80 + 1;
        iVar15 = iVar19;
      }
      iVar18 = iVar18 + 1;
      iVar19 = iVar15;
      if (count == iVar18) {
        return local_80;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}